

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O0

int __thiscall Server::Private::remove(Private *this,char *__filename)

{
  bool bVar1;
  int iVar2;
  Iterator *pIVar3;
  TimerImpl **ppTVar4;
  long *plVar5;
  Iterator local_28;
  Iterator end;
  Iterator i;
  TimerImpl *timer_local;
  Private *this_local;
  
  end = MultiMap<long,_Server::Private::TimerImpl_*>::find
                  (&this->_queuedTimers,(long *)(__filename + 8));
  pIVar3 = MultiMap<long,_Server::Private::TimerImpl_*>::end(&this->_queuedTimers);
  local_28.item = pIVar3->item;
  do {
    bVar1 = MultiMap<long,_Server::Private::TimerImpl_*>::Iterator::operator!=(&end,&local_28);
    if (!bVar1) {
LAB_00114b52:
      iVar2 = PoolList<Server::Private::TimerImpl>::remove(&this->_timers,__filename);
      return iVar2;
    }
    ppTVar4 = MultiMap<long,_Server::Private::TimerImpl_*>::Iterator::operator*(&end);
    if (*ppTVar4 == (TimerImpl *)__filename) {
      MultiMap<long,_Server::Private::TimerImpl_*>::remove(&this->_queuedTimers,(char *)&end);
      goto LAB_00114b52;
    }
    plVar5 = MultiMap<long,_Server::Private::TimerImpl_*>::Iterator::key(&end);
    if (*plVar5 != *(long *)(__filename + 8)) goto LAB_00114b52;
    MultiMap<long,_Server::Private::TimerImpl_*>::Iterator::operator++(&end);
  } while( true );
}

Assistant:

void Server::Private::remove(TimerImpl &timer)
{
  for (MultiMap<int64, TimerImpl *>::Iterator i = _queuedTimers.find(timer.executionTime), end = _queuedTimers.end(); i != end; ++i)
  {
    if (*i == &timer)
    {
      _queuedTimers.remove(i);
      break;
    }
    if (i.key() != timer.executionTime)
      break;
  }
  _timers.remove(timer);
}